

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDFJob.cc
# Opt level: O0

void __thiscall
QPDFJob::handlePageSpecs
          (QPDFJob *this,QPDF *pdf,
          vector<std::unique_ptr<QPDF,_std::default_delete<QPDF>_>,_std::allocator<std::unique_ptr<QPDF,_std::default_delete<QPDF>_>_>_>
          *page_heap)

{
  size_t *psVar1;
  __shared_count<(__gnu_cxx::_Lock_policy)2> *this_00;
  value_type vVar2;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var3;
  QPDFPageData *__n;
  bool bVar4;
  __type _Var5;
  bool bVar6;
  int iVar7;
  element_type *peVar8;
  size_type sVar9;
  element_type *peVar10;
  mapped_type *ppQVar11;
  size_type sVar12;
  ulong uVar13;
  ClosedFileInputSource *pCVar14;
  char *pcVar15;
  FileInputSource *this_01;
  pointer pQVar16;
  size_type sVar17;
  element_type *peVar18;
  reference pvVar19;
  reference __args;
  size_type sVar20;
  reference __args_1;
  reference __x;
  size_type sVar21;
  mapped_type *ppCVar22;
  reference piVar23;
  size_t sVar24;
  reference pvVar25;
  mapped_type *pmVar26;
  mapped_type_conflict1 *pmVar27;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var28;
  reference pvVar29;
  size_type sVar30;
  reference pQVar31;
  size_type sVar32;
  long new_start_idx;
  bool bVar33;
  pair<std::_Rb_tree_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_bool>
  pVar34;
  pair<std::_Rb_tree_const_iterator<int>,_bool> pVar35;
  pair<std::_Rb_tree_const_iterator<QPDFObjGen>,_bool> pVar36;
  allocator<char> local_a99;
  string local_a98;
  QPDFObjectHandle local_a78;
  allocator<char> local_a61;
  string local_a60;
  QPDFObjGen local_a40;
  reference local_a38;
  T *field_1;
  iterator __end3_1;
  iterator __begin3_1;
  QPDFArrayItems *__range3_1;
  QPDFObjectHandle local_9b8;
  undefined1 local_9a8 [8];
  QPDFObjectHandle new_fields;
  string local_990 [32];
  undefined1 local_970 [8];
  QPDFObjectHandle fields;
  string local_958 [32];
  undefined1 local_938 [24];
  QPDFObjectHandle acroform;
  QPDFObjectHelper local_908;
  undefined1 local_8e0 [32];
  QPDFFormFieldObjectHelper field;
  iterator __end3;
  iterator __begin3;
  vector<QPDFFormFieldObjectHelper,_std::allocator<QPDFFormFieldObjectHelper>_> local_848;
  vector<QPDFFormFieldObjectHelper,_std::allocator<QPDFFormFieldObjectHelper>_> *local_830;
  vector<QPDFFormFieldObjectHelper,_std::allocator<QPDFFormFieldObjectHelper>_> *__range3;
  undefined1 local_820 [8];
  value_type page_1;
  size_t pageno_1;
  string local_7d8;
  QPDFObjectHandle local_7b8;
  QPDFObjectHandle local_7a8;
  allocator<char> local_791;
  string local_790;
  undefined1 local_770 [8];
  QPDFObjectHandle page_labels;
  exception *e;
  QPDFObjectHandle local_6b8;
  QPDFPageObjectHelper local_6a8;
  undefined1 local_670 [8];
  QPDFObjectHandle new_page;
  undefined1 local_648 [6];
  bool this_file;
  bool first_copy_from_orig;
  _Base_ptr local_610;
  undefined1 local_608;
  QPDFPageObjectHelper local_600;
  unsigned_long_long local_5c8;
  unsigned_long_long from_uuid;
  QPDFObjGen local_5b0;
  QPDFObjGen to_copy_og;
  undefined1 local_598 [8];
  QPDFPageObjectHelper to_copy;
  int pageno;
  int pageno_iter;
  iterator __end2_2;
  iterator __begin2_2;
  vector<int,_std::allocator<int>_> *__range2_2;
  function<void_(Pipeline_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  local_538;
  QPDFAcroFormDocumentHelper *local_518;
  QPDFAcroFormDocumentHelper *other_afdh;
  QPDFPageLabelDocumentHelper pldh;
  ClosedFileInputSource *cis_2;
  QPDFPageData *page_data_1;
  iterator __end1_3;
  iterator __begin1_3;
  vector<(anonymous_namespace)::QPDFPageData,_std::allocator<(anonymous_namespace)::QPDFPageData>_>
  *__range1_3;
  set<QPDFObjGen,_std::less<QPDFObjGen>,_std::allocator<QPDFObjGen>_> referenced_fields;
  QPDFAcroFormDocumentHelper *this_afdh;
  map<unsigned_long_long,_std::shared_ptr<QPDFAcroFormDocumentHelper>,_std::less<unsigned_long_long>,_std::allocator<std::pair<const_unsigned_long_long,_std::shared_ptr<QPDFAcroFormDocumentHelper>_>_>_>
  afdh_map;
  int out_pageno;
  bool any_page_labels;
  vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_> new_labels;
  set<int,_std::less<int>,_std::allocator<int>_> selected_from_orig;
  size_t j;
  QPDFPageData *page_data;
  size_t i_1;
  bool got_pages;
  value_type_conflict4 vStack_3f0;
  undefined1 local_3e8 [8];
  vector<unsigned_long,_std::allocator<unsigned_long>_> cur_page;
  size_type i;
  vector<(anonymous_namespace)::QPDFPageData,_std::allocator<(anonymous_namespace)::QPDFPageData>_>
  new_parsed_specs;
  string local_3a8;
  QPDFPageData *local_388;
  size_type n_specs;
  size_type n_collate;
  reference local_340;
  QPDFPageObjectHelper *page;
  iterator __end1_2;
  iterator __begin1_2;
  vector<QPDFPageObjectHelper,_std::allocator<QPDFPageObjectHelper>_> *__range1_2;
  vector<QPDFPageObjectHelper,_std::allocator<QPDFPageObjectHelper>_> orig_pages;
  QPDFPageDocumentHelper dh;
  function<void_(Pipeline_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  local_2e0;
  unsigned_long_long local_2c0;
  unsigned_long_long other_uuid;
  QPDF *other;
  ClosedFileInputSource *cis_1;
  string *filename;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_QPDF_*>
  *iter;
  iterator __end2_1;
  iterator __begin2_1;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_QPDF_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_QPDF_*>_>_>
  *__range2_1;
  map<unsigned_long_long,_bool,_std::less<unsigned_long_long>,_std::allocator<std::pair<const_unsigned_long_long,_bool>_>_>
  remove_unreferenced;
  unique_ptr<QPDF,_std::default_delete<QPDF>_> local_240;
  unique_ptr<QPDF,_std::default_delete<QPDF>_> qpdf_sp;
  FileInputSource *fis;
  ClosedFileInputSource *local_210;
  ClosedFileInputSource *cis;
  shared_ptr<InputSource> is;
  function<void_(Pipeline_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  local_1f0;
  element_type *local_1d0;
  char *password;
  PageSpec *page_spec_2;
  iterator __end1_1;
  iterator __begin1_1;
  vector<QPDFJob::PageSpec,_std::allocator<QPDFJob::PageSpec>_> *__range1_1;
  map<unsigned_long_long,_std::set<QPDFObjGen,_std::less<QPDFObjGen>,_std::allocator<QPDFObjGen>_>,_std::less<unsigned_long_long>,_std::allocator<std::pair<const_unsigned_long_long,_std::set<QPDFObjGen,_std::less<QPDFObjGen>,_std::allocator<QPDFObjGen>_>_>_>_>
  copied_pages;
  vector<(anonymous_namespace)::QPDFPageData,_std::allocator<(anonymous_namespace)::QPDFPageData>_>
  parsed_specs;
  key_type local_158;
  undefined1 local_138 [8];
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ClosedFileInputSource_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ClosedFileInputSource_*>_>_>
  page_spec_cfis;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_QPDF_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_QPDF_*>_>_>
  page_spec_qpdfs;
  function<void_(Pipeline_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  local_d0;
  _Base_ptr local_b0;
  undefined1 local_a8;
  reference local_90;
  PageSpec *page_spec_1;
  iterator __end2;
  iterator __begin2;
  vector<QPDFJob::PageSpec,_std::allocator<QPDFJob::PageSpec>_> *__range2;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  filenames;
  PageSpec *page_spec;
  iterator __end1;
  iterator __begin1;
  vector<QPDFJob::PageSpec,_std::allocator<QPDFJob::PageSpec>_> *__range1;
  vector<std::unique_ptr<QPDF,_std::default_delete<QPDF>_>,_std::allocator<std::unique_ptr<QPDF,_std::default_delete<QPDF>_>_>_>
  *page_heap_local;
  QPDF *pdf_local;
  QPDFJob *this_local;
  
  peVar8 = std::__shared_ptr_access<QPDFJob::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<QPDFJob::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)this);
  __end1 = std::vector<QPDFJob::PageSpec,_std::allocator<QPDFJob::PageSpec>_>::begin
                     (&peVar8->page_specs);
  page_spec = (PageSpec *)
              std::vector<QPDFJob::PageSpec,_std::allocator<QPDFJob::PageSpec>_>::end
                        (&peVar8->page_specs);
  while (bVar4 = __gnu_cxx::operator!=
                           (&__end1,(__normal_iterator<QPDFJob::PageSpec_*,_std::vector<QPDFJob::PageSpec,_std::allocator<QPDFJob::PageSpec>_>_>
                                     *)&page_spec), bVar4) {
    filenames._M_t._M_impl.super__Rb_tree_header._M_node_count =
         (size_t)__gnu_cxx::
                 __normal_iterator<QPDFJob::PageSpec_*,_std::vector<QPDFJob::PageSpec,_std::allocator<QPDFJob::PageSpec>_>_>
                 ::operator*(&__end1);
    bVar4 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            filenames._M_t._M_impl.super__Rb_tree_header._M_node_count,".");
    if (bVar4) {
      peVar8 = std::__shared_ptr_access<QPDFJob::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->((__shared_ptr_access<QPDFJob::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)this);
      peVar10 = std::__shared_ptr<char,_(__gnu_cxx::_Lock_policy)2>::get
                          (&(peVar8->infilename).
                            super___shared_ptr<char,_(__gnu_cxx::_Lock_policy)2>);
      std::__cxx11::string::operator=
                ((string *)filenames._M_t._M_impl.super__Rb_tree_header._M_node_count,peVar10);
    }
    uVar13 = std::__cxx11::string::empty();
    if ((uVar13 & 1) != 0) {
      std::__cxx11::string::operator=
                ((string *)(filenames._M_t._M_impl.super__Rb_tree_header._M_node_count + 0x30),"1-z"
                );
    }
    __gnu_cxx::
    __normal_iterator<QPDFJob::PageSpec_*,_std::vector<QPDFJob::PageSpec,_std::allocator<QPDFJob::PageSpec>_>_>
    ::operator++(&__end1);
  }
  peVar8 = std::__shared_ptr_access<QPDFJob::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<QPDFJob::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)this);
  if ((peVar8->keep_files_open_set & 1U) == 0) {
    std::
    set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::set((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           *)&__range2);
    peVar8 = std::__shared_ptr_access<QPDFJob::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<QPDFJob::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)this);
    __end2 = std::vector<QPDFJob::PageSpec,_std::allocator<QPDFJob::PageSpec>_>::begin
                       (&peVar8->page_specs);
    page_spec_1 = (PageSpec *)
                  std::vector<QPDFJob::PageSpec,_std::allocator<QPDFJob::PageSpec>_>::end
                            (&peVar8->page_specs);
    while (bVar4 = __gnu_cxx::operator!=
                             (&__end2,(__normal_iterator<QPDFJob::PageSpec_*,_std::vector<QPDFJob::PageSpec,_std::allocator<QPDFJob::PageSpec>_>_>
                                       *)&page_spec_1), bVar4) {
      local_90 = __gnu_cxx::
                 __normal_iterator<QPDFJob::PageSpec_*,_std::vector<QPDFJob::PageSpec,_std::allocator<QPDFJob::PageSpec>_>_>
                 ::operator*(&__end2);
      pVar34 = std::
               set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::insert((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         *)&__range2,&local_90->filename);
      local_b0 = (_Base_ptr)pVar34.first._M_node;
      local_a8 = pVar34.second;
      __gnu_cxx::
      __normal_iterator<QPDFJob::PageSpec_*,_std::vector<QPDFJob::PageSpec,_std::allocator<QPDFJob::PageSpec>_>_>
      ::operator++(&__end2);
    }
    sVar9 = std::
            set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::size((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)&__range2);
    peVar8 = std::__shared_ptr_access<QPDFJob::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<QPDFJob::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)this);
    uVar13 = peVar8->keep_files_open_threshold;
    peVar8 = std::__shared_ptr_access<QPDFJob::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<QPDFJob::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)this);
    peVar8->keep_files_open = sVar9 <= uVar13;
    peVar8 = std::__shared_ptr_access<QPDFJob::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<QPDFJob::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)this);
    QTC::TC("qpdf","QPDFJob automatically set keep files open",(byte)~peVar8->keep_files_open & 1);
    page_spec_qpdfs._M_t._M_impl.super__Rb_tree_header._M_node_count = (size_t)this;
    std::function<void(Pipeline&,std::__cxx11::string_const&)>::
    function<QPDFJob::handlePageSpecs(QPDF&,std::vector<std::unique_ptr<QPDF,std::default_delete<QPDF>>,std::allocator<std::unique_ptr<QPDF,std::default_delete<QPDF>>>>&)::__0,void>
              ((function<void(Pipeline&,std::__cxx11::string_const&)> *)&local_d0,
               (anon_class_8_1_8991fb9c *)
               &page_spec_qpdfs._M_t._M_impl.super__Rb_tree_header._M_node_count);
    doIfVerbose(this,&local_d0);
    std::
    function<void_(Pipeline_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
    ::~function(&local_d0);
    std::
    set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~set((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)&__range2);
  }
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_QPDF_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_QPDF_*>_>_>
  ::map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_QPDF_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_QPDF_*>_>_>
         *)&page_spec_cfis._M_t._M_impl.super__Rb_tree_header._M_node_count);
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ClosedFileInputSource_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ClosedFileInputSource_*>_>_>
  ::map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ClosedFileInputSource_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ClosedFileInputSource_*>_>_>
         *)local_138);
  peVar8 = std::__shared_ptr_access<QPDFJob::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<QPDFJob::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)this);
  peVar10 = std::__shared_ptr<char,_(__gnu_cxx::_Lock_policy)2>::get
                      (&(peVar8->infilename).super___shared_ptr<char,_(__gnu_cxx::_Lock_policy)2>);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_158,peVar10,
             (allocator<char> *)
             ((long)&parsed_specs.
                     super__Vector_base<(anonymous_namespace)::QPDFPageData,_std::allocator<(anonymous_namespace)::QPDFPageData>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
  ppQVar11 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_QPDF_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_QPDF_*>_>_>
             ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_QPDF_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_QPDF_*>_>_>
                           *)&page_spec_cfis._M_t._M_impl.super__Rb_tree_header._M_node_count,
                          &local_158);
  *ppQVar11 = pdf;
  std::__cxx11::string::~string((string *)&local_158);
  std::allocator<char>::~allocator
            ((allocator<char> *)
             ((long)&parsed_specs.
                     super__Vector_base<(anonymous_namespace)::QPDFPageData,_std::allocator<(anonymous_namespace)::QPDFPageData>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
  std::
  vector<(anonymous_namespace)::QPDFPageData,_std::allocator<(anonymous_namespace)::QPDFPageData>_>
  ::vector((vector<(anonymous_namespace)::QPDFPageData,_std::allocator<(anonymous_namespace)::QPDFPageData>_>
            *)&copied_pages._M_t._M_impl.super__Rb_tree_header._M_node_count);
  std::
  map<unsigned_long_long,_std::set<QPDFObjGen,_std::less<QPDFObjGen>,_std::allocator<QPDFObjGen>_>,_std::less<unsigned_long_long>,_std::allocator<std::pair<const_unsigned_long_long,_std::set<QPDFObjGen,_std::less<QPDFObjGen>,_std::allocator<QPDFObjGen>_>_>_>_>
  ::map((map<unsigned_long_long,_std::set<QPDFObjGen,_std::less<QPDFObjGen>,_std::allocator<QPDFObjGen>_>,_std::less<unsigned_long_long>,_std::allocator<std::pair<const_unsigned_long_long,_std::set<QPDFObjGen,_std::less<QPDFObjGen>,_std::allocator<QPDFObjGen>_>_>_>_>
         *)&__range1_1);
  peVar8 = std::__shared_ptr_access<QPDFJob::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<QPDFJob::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)this);
  __end1_1 = std::vector<QPDFJob::PageSpec,_std::allocator<QPDFJob::PageSpec>_>::begin
                       (&peVar8->page_specs);
  page_spec_2 = (PageSpec *)
                std::vector<QPDFJob::PageSpec,_std::allocator<QPDFJob::PageSpec>_>::end
                          (&peVar8->page_specs);
  while (bVar4 = __gnu_cxx::operator!=
                           (&__end1_1,
                            (__normal_iterator<QPDFJob::PageSpec_*,_std::vector<QPDFJob::PageSpec,_std::allocator<QPDFJob::PageSpec>_>_>
                             *)&page_spec_2), bVar4) {
    password = (char *)__gnu_cxx::
                       __normal_iterator<QPDFJob::PageSpec_*,_std::vector<QPDFJob::PageSpec,_std::allocator<QPDFJob::PageSpec>_>_>
                       ::operator*(&__end1_1);
    sVar12 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_QPDF_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_QPDF_*>_>_>
             ::count((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_QPDF_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_QPDF_*>_>_>
                      *)&page_spec_cfis._M_t._M_impl.super__Rb_tree_header._M_node_count,
                     (key_type *)password);
    if (sVar12 == 0) {
      local_1d0 = std::__shared_ptr<char,_(__gnu_cxx::_Lock_policy)2>::get
                            ((__shared_ptr<char,_(__gnu_cxx::_Lock_policy)2> *)(password + 0x20));
      std::__shared_ptr_access<QPDFJob::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
      operator->((__shared_ptr_access<QPDFJob::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                 this);
      uVar13 = std::__cxx11::string::empty();
      pcVar15 = password;
      if (((uVar13 & 1) == 0) && (local_1d0 == (element_type *)0x0)) {
        peVar8 = std::
                 __shared_ptr_access<QPDFJob::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                 operator->((__shared_ptr_access<QPDFJob::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)this);
        _Var5 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )pcVar15,&peVar8->encryption_file);
        if (_Var5) {
          QTC::TC("qpdf","QPDFJob pages encryption password",0);
          peVar8 = std::
                   __shared_ptr_access<QPDFJob::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                   operator->((__shared_ptr_access<QPDFJob::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)this);
          local_1d0 = std::__shared_ptr<char,_(__gnu_cxx::_Lock_policy)2>::get
                                (&(peVar8->encryption_file_password).
                                  super___shared_ptr<char,_(__gnu_cxx::_Lock_policy)2>);
        }
      }
      is.super___shared_ptr<InputSource,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
           (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)password;
      std::function<void(Pipeline&,std::__cxx11::string_const&)>::
      function<QPDFJob::handlePageSpecs(QPDF&,std::vector<std::unique_ptr<QPDF,std::default_delete<QPDF>>,std::allocator<std::unique_ptr<QPDF,std::default_delete<QPDF>>>>&)::__1,void>
                ((function<void(Pipeline&,std::__cxx11::string_const&)> *)&local_1f0,
                 (anon_class_8_1_4a47160b *)
                 &is.super___shared_ptr<InputSource,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
      doIfVerbose(this,&local_1f0);
      std::
      function<void_(Pipeline_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
      ::~function(&local_1f0);
      std::shared_ptr<InputSource>::shared_ptr((shared_ptr<InputSource> *)&cis);
      local_210 = (ClosedFileInputSource *)0x0;
      peVar8 = std::__shared_ptr_access<QPDFJob::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->((__shared_ptr_access<QPDFJob::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)this);
      if ((peVar8->keep_files_open & 1U) == 0) {
        QTC::TC("qpdf","QPDFJob keep files open n",0);
        pCVar14 = (ClosedFileInputSource *)operator_new(0xe8);
        pcVar15 = (char *)std::__cxx11::string::c_str();
        ClosedFileInputSource::ClosedFileInputSource(pCVar14,pcVar15);
        local_210 = pCVar14;
        std::shared_ptr<InputSource>::shared_ptr<ClosedFileInputSource,void>
                  ((shared_ptr<InputSource> *)&fis,pCVar14);
        std::shared_ptr<InputSource>::operator=
                  ((shared_ptr<InputSource> *)&cis,(shared_ptr<InputSource> *)&fis);
        std::shared_ptr<InputSource>::~shared_ptr((shared_ptr<InputSource> *)&fis);
        ClosedFileInputSource::stayOpen(local_210,true);
      }
      else {
        QTC::TC("qpdf","QPDFJob keep files open y",0);
        this_01 = (FileInputSource *)operator_new(0xd8);
        pcVar15 = (char *)std::__cxx11::string::c_str();
        FileInputSource::FileInputSource(this_01,pcVar15);
        std::shared_ptr<InputSource>::shared_ptr<FileInputSource,void>
                  ((shared_ptr<InputSource> *)&qpdf_sp,this_01);
        std::shared_ptr<InputSource>::operator=
                  ((shared_ptr<InputSource> *)&cis,(shared_ptr<InputSource> *)&qpdf_sp);
        std::shared_ptr<InputSource>::~shared_ptr((shared_ptr<InputSource> *)&qpdf_sp);
      }
      std::unique_ptr<QPDF,std::default_delete<QPDF>>::unique_ptr<std::default_delete<QPDF>,void>
                ((unique_ptr<QPDF,std::default_delete<QPDF>> *)&local_240);
      psVar1 = &remove_unreferenced._M_t._M_impl.super__Rb_tree_header._M_node_count;
      std::shared_ptr<InputSource>::shared_ptr
                ((shared_ptr<InputSource> *)psVar1,(shared_ptr<InputSource> *)&cis);
      processInputSource(this,&local_240,(shared_ptr<InputSource> *)psVar1,local_1d0,true);
      std::shared_ptr<InputSource>::~shared_ptr
                ((shared_ptr<InputSource> *)
                 &remove_unreferenced._M_t._M_impl.super__Rb_tree_header._M_node_count);
      pQVar16 = std::unique_ptr<QPDF,_std::default_delete<QPDF>_>::get(&local_240);
      ppQVar11 = std::
                 map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_QPDF_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_QPDF_*>_>_>
                 ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_QPDF_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_QPDF_*>_>_>
                               *)&page_spec_cfis._M_t._M_impl.super__Rb_tree_header._M_node_count,
                              (key_type *)password);
      *ppQVar11 = pQVar16;
      std::
      vector<std::unique_ptr<QPDF,_std::default_delete<QPDF>_>,_std::allocator<std::unique_ptr<QPDF,_std::default_delete<QPDF>_>_>_>
      ::push_back(page_heap,&local_240);
      if (local_210 != (ClosedFileInputSource *)0x0) {
        ClosedFileInputSource::stayOpen(local_210,false);
        pCVar14 = local_210;
        ppCVar22 = std::
                   map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ClosedFileInputSource_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ClosedFileInputSource_*>_>_>
                   ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ClosedFileInputSource_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ClosedFileInputSource_*>_>_>
                                 *)local_138,(key_type *)password);
        *ppCVar22 = pCVar14;
      }
      std::unique_ptr<QPDF,_std::default_delete<QPDF>_>::~unique_ptr(&local_240);
      std::shared_ptr<InputSource>::~shared_ptr((shared_ptr<InputSource> *)&cis);
    }
    pcVar15 = password;
    ppQVar11 = std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_QPDF_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_QPDF_*>_>_>
               ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_QPDF_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_QPDF_*>_>_>
                             *)&page_spec_cfis._M_t._M_impl.super__Rb_tree_header._M_node_count,
                            (key_type *)password);
    std::
    vector<(anonymous_namespace)::QPDFPageData,std::allocator<(anonymous_namespace)::QPDFPageData>>
    ::emplace_back<std::__cxx11::string&,QPDF*&,std::__cxx11::string&>
              ((vector<(anonymous_namespace)::QPDFPageData,std::allocator<(anonymous_namespace)::QPDFPageData>>
                *)&copied_pages._M_t._M_impl.super__Rb_tree_header._M_node_count,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)pcVar15,ppQVar11
               ,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                (password + 0x30));
    __gnu_cxx::
    __normal_iterator<QPDFJob::PageSpec_*,_std::vector<QPDFJob::PageSpec,_std::allocator<QPDFJob::PageSpec>_>_>
    ::operator++(&__end1_1);
  }
  std::
  map<unsigned_long_long,_bool,_std::less<unsigned_long_long>,_std::allocator<std::pair<const_unsigned_long_long,_bool>_>_>
  ::map((map<unsigned_long_long,_bool,_std::less<unsigned_long_long>,_std::allocator<std::pair<const_unsigned_long_long,_bool>_>_>
         *)&__range2_1);
  peVar8 = std::__shared_ptr_access<QPDFJob::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<QPDFJob::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)this);
  if (peVar8->remove_unreferenced_page_resources != re_no) {
    psVar1 = &page_spec_cfis._M_t._M_impl.super__Rb_tree_header._M_node_count;
    __end2_1 = std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_QPDF_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_QPDF_*>_>_>
               ::begin((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_QPDF_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_QPDF_*>_>_>
                        *)psVar1);
    iter = (pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_QPDF_*>
            *)std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_QPDF_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_QPDF_*>_>_>
              ::end((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_QPDF_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_QPDF_*>_>_>
                     *)psVar1);
    while (bVar4 = std::operator!=(&__end2_1,(_Self *)&iter), bVar4) {
      cis_1 = (ClosedFileInputSource *)
              std::
              _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_QPDF_*>_>
              ::operator*(&__end2_1);
      other = (QPDF *)0x0;
      filename = (string *)cis_1;
      sVar21 = std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ClosedFileInputSource_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ClosedFileInputSource_*>_>_>
               ::count((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ClosedFileInputSource_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ClosedFileInputSource_*>_>_>
                        *)local_138,(key_type *)cis_1);
      if (sVar21 != 0) {
        ppCVar22 = std::
                   map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ClosedFileInputSource_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ClosedFileInputSource_*>_>_>
                   ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ClosedFileInputSource_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ClosedFileInputSource_*>_>_>
                                 *)local_138,(key_type *)cis_1);
        other = (QPDF *)*ppCVar22;
        ClosedFileInputSource::stayOpen((ClosedFileInputSource *)other,true);
      }
      other_uuid = *(unsigned_long_long *)(filename + 1);
      local_2c0 = QPDF::getUniqueId((QPDF *)other_uuid);
      sVar17 = std::
               map<unsigned_long_long,_bool,_std::less<unsigned_long_long>,_std::allocator<std::pair<const_unsigned_long_long,_bool>_>_>
               ::count((map<unsigned_long_long,_bool,_std::less<unsigned_long_long>,_std::allocator<std::pair<const_unsigned_long_long,_bool>_>_>
                        *)&__range2_1,&local_2c0);
      if (sVar17 == 0) {
        bVar4 = shouldRemoveUnreferencedResources(this,(QPDF *)other_uuid);
        pmVar27 = std::
                  map<unsigned_long_long,_bool,_std::less<unsigned_long_long>,_std::allocator<std::pair<const_unsigned_long_long,_bool>_>_>
                  ::operator[]((map<unsigned_long_long,_bool,_std::less<unsigned_long_long>,_std::allocator<std::pair<const_unsigned_long_long,_bool>_>_>
                                *)&__range2_1,&local_2c0);
        *pmVar27 = bVar4;
      }
      if (other != (QPDF *)0x0) {
        ClosedFileInputSource::stayOpen((ClosedFileInputSource *)other,false);
      }
      std::
      _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_QPDF_*>_>
      ::operator++(&__end2_1);
    }
  }
  std::function<void(Pipeline&,std::__cxx11::string_const&)>::
  function<QPDFJob::handlePageSpecs(QPDF&,std::vector<std::unique_ptr<QPDF,std::default_delete<QPDF>>,std::allocator<std::unique_ptr<QPDF,std::default_delete<QPDF>>>>&)::__2,void>
            ((function<void(Pipeline&,std::__cxx11::string_const&)> *)&local_2e0,
             (anon_class_1_0_00000001 *)
             ((long)&dh.m.
                     super___shared_ptr<QPDFPageDocumentHelper::Members,_(__gnu_cxx::_Lock_policy)2>
                     ._M_refcount._M_pi + 7));
  doIfVerbose(this,&local_2e0);
  std::
  function<void_(Pipeline_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  ::~function(&local_2e0);
  QPDFPageDocumentHelper::QPDFPageDocumentHelper
            ((QPDFPageDocumentHelper *)
             &orig_pages.
              super__Vector_base<QPDFPageObjectHelper,_std::allocator<QPDFPageObjectHelper>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage,pdf);
  QPDFPageDocumentHelper::getAllPages
            ((vector<QPDFPageObjectHelper,_std::allocator<QPDFPageObjectHelper>_> *)&__range1_2,
             (QPDFPageDocumentHelper *)
             &orig_pages.
              super__Vector_base<QPDFPageObjectHelper,_std::allocator<QPDFPageObjectHelper>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage);
  __end1_2 = std::vector<QPDFPageObjectHelper,_std::allocator<QPDFPageObjectHelper>_>::begin
                       ((vector<QPDFPageObjectHelper,_std::allocator<QPDFPageObjectHelper>_> *)
                        &__range1_2);
  page = (QPDFPageObjectHelper *)
         std::vector<QPDFPageObjectHelper,_std::allocator<QPDFPageObjectHelper>_>::end
                   ((vector<QPDFPageObjectHelper,_std::allocator<QPDFPageObjectHelper>_> *)
                    &__range1_2);
  while (bVar4 = __gnu_cxx::operator!=
                           (&__end1_2,
                            (__normal_iterator<QPDFPageObjectHelper_*,_std::vector<QPDFPageObjectHelper,_std::allocator<QPDFPageObjectHelper>_>_>
                             *)&page), bVar4) {
    local_340 = __gnu_cxx::
                __normal_iterator<QPDFPageObjectHelper_*,_std::vector<QPDFPageObjectHelper,_std::allocator<QPDFPageObjectHelper>_>_>
                ::operator*(&__end1_2);
    QPDFPageObjectHelper::QPDFPageObjectHelper((QPDFPageObjectHelper *)&n_collate,local_340);
    QPDFPageDocumentHelper::removePage
              ((QPDFPageDocumentHelper *)
               &orig_pages.
                super__Vector_base<QPDFPageObjectHelper,_std::allocator<QPDFPageObjectHelper>_>.
                _M_impl.super__Vector_impl_data._M_end_of_storage,(QPDFPageObjectHelper *)&n_collate
              );
    QPDFPageObjectHelper::~QPDFPageObjectHelper((QPDFPageObjectHelper *)&n_collate);
    __gnu_cxx::
    __normal_iterator<QPDFPageObjectHelper_*,_std::vector<QPDFPageObjectHelper,_std::allocator<QPDFPageObjectHelper>_>_>
    ::operator++(&__end1_2);
  }
  peVar8 = std::__shared_ptr_access<QPDFJob::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<QPDFJob::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)this);
  n_specs = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::size(&peVar8->collate);
  local_388 = (QPDFPageData *)
              std::
              vector<(anonymous_namespace)::QPDFPageData,_std::allocator<(anonymous_namespace)::QPDFPageData>_>
              ::size((vector<(anonymous_namespace)::QPDFPageData,_std::allocator<(anonymous_namespace)::QPDFPageData>_>
                      *)&copied_pages._M_t._M_impl.super__Rb_tree_header._M_node_count);
  if (((n_specs != 0) && (n_specs != 1)) && ((QPDFPageData *)n_specs != local_388)) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_3a8,
               "--pages: if --collate has more than one value, it must have one value per page specification"
               ,(allocator<char> *)
                ((long)&new_parsed_specs.
                        super__Vector_base<(anonymous_namespace)::QPDFPageData,_std::allocator<(anonymous_namespace)::QPDFPageData>_>
                        ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
    usage(&local_3a8);
    std::__cxx11::string::~string((string *)&local_3a8);
    std::allocator<char>::~allocator
              ((allocator<char> *)
               ((long)&new_parsed_specs.
                       super__Vector_base<(anonymous_namespace)::QPDFPageData,_std::allocator<(anonymous_namespace)::QPDFPageData>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
  }
  if ((n_specs != 0) && ((QPDFPageData *)0x1 < local_388)) {
    std::
    vector<(anonymous_namespace)::QPDFPageData,_std::allocator<(anonymous_namespace)::QPDFPageData>_>
    ::vector((vector<(anonymous_namespace)::QPDFPageData,_std::allocator<(anonymous_namespace)::QPDFPageData>_>
              *)&i);
    for (cur_page.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
         super__Vector_impl_data._M_end_of_storage = (pointer)n_specs; __n = local_388,
        cur_page.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage < local_388;
        cur_page.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage =
             (pointer)((long)cur_page.
                             super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                             _M_impl.super__Vector_impl_data._M_end_of_storage + 1)) {
      peVar8 = std::__shared_ptr_access<QPDFJob::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->((__shared_ptr_access<QPDFJob::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)this);
      peVar18 = std::__shared_ptr_access<QPDFJob::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                ::operator->((__shared_ptr_access<QPDFJob::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                              *)this);
      pvVar19 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::at(&peVar18->collate,0);
      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::push_back
                (&peVar8->collate,pvVar19);
    }
    vStack_3f0 = 0;
    std::allocator<unsigned_long>::allocator((allocator<unsigned_long> *)((long)&i_1 + 7));
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
              ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_3e8,(size_type)__n,
               &stack0xfffffffffffffc10,(allocator<unsigned_long> *)((long)&i_1 + 7));
    std::allocator<unsigned_long>::~allocator((allocator<unsigned_long> *)((long)&i_1 + 7));
    i_1._6_1_ = 1;
    while ((i_1._6_1_ & 1) != 0) {
      i_1._6_1_ = 0;
      for (page_data = (QPDFPageData *)0x0; page_data < local_388;
          page_data = (QPDFPageData *)&(page_data->filename).field_0x1) {
        __args = std::
                 vector<(anonymous_namespace)::QPDFPageData,_std::allocator<(anonymous_namespace)::QPDFPageData>_>
                 ::at((vector<(anonymous_namespace)::QPDFPageData,_std::allocator<(anonymous_namespace)::QPDFPageData>_>
                       *)&copied_pages._M_t._M_impl.super__Rb_tree_header._M_node_count,
                      (size_type)page_data);
        selected_from_orig._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
        while( true ) {
          peVar8 = std::
                   __shared_ptr_access<QPDFJob::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                   operator->((__shared_ptr_access<QPDFJob::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)this);
          pvVar19 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::at
                              (&peVar8->collate,(size_type)page_data);
          if (*pvVar19 <= selected_from_orig._M_t._M_impl.super__Rb_tree_header._M_node_count)
          break;
          pvVar19 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::at
                              ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_3e8,
                               (size_type)page_data);
          vVar2 = *pvVar19;
          sVar20 = std::vector<int,_std::allocator<int>_>::size(&__args->selected_pages);
          if (vVar2 + selected_from_orig._M_t._M_impl.super__Rb_tree_header._M_node_count < sVar20)
          {
            i_1._6_1_ = 1;
            pvVar19 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::at
                                ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_3e8,
                                 (size_type)page_data);
            __args_1 = std::vector<int,_std::allocator<int>_>::at
                                 (&__args->selected_pages,
                                  *pvVar19 +
                                  selected_from_orig._M_t._M_impl.super__Rb_tree_header.
                                  _M_node_count);
            std::
            vector<(anonymous_namespace)::QPDFPageData,std::allocator<(anonymous_namespace)::QPDFPageData>>
            ::emplace_back<(anonymous_namespace)::QPDFPageData&,int&>
                      ((vector<(anonymous_namespace)::QPDFPageData,std::allocator<(anonymous_namespace)::QPDFPageData>>
                        *)&i,__args,__args_1);
          }
          selected_from_orig._M_t._M_impl.super__Rb_tree_header._M_node_count =
               selected_from_orig._M_t._M_impl.super__Rb_tree_header._M_node_count + 1;
        }
        peVar8 = std::
                 __shared_ptr_access<QPDFJob::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                 operator->((__shared_ptr_access<QPDFJob::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)this);
        pvVar19 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::at
                            (&peVar8->collate,(size_type)page_data);
        vVar2 = *pvVar19;
        pvVar19 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::at
                            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_3e8,
                             (size_type)page_data);
        *pvVar19 = vVar2 + *pvVar19;
      }
    }
    std::
    vector<(anonymous_namespace)::QPDFPageData,_std::allocator<(anonymous_namespace)::QPDFPageData>_>
    ::operator=((vector<(anonymous_namespace)::QPDFPageData,_std::allocator<(anonymous_namespace)::QPDFPageData>_>
                 *)&copied_pages._M_t._M_impl.super__Rb_tree_header._M_node_count,
                (vector<(anonymous_namespace)::QPDFPageData,_std::allocator<(anonymous_namespace)::QPDFPageData>_>
                 *)&i);
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector
              ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_3e8);
    std::
    vector<(anonymous_namespace)::QPDFPageData,_std::allocator<(anonymous_namespace)::QPDFPageData>_>
    ::~vector((vector<(anonymous_namespace)::QPDFPageData,_std::allocator<(anonymous_namespace)::QPDFPageData>_>
               *)&i);
  }
  std::set<int,_std::less<int>,_std::allocator<int>_>::set
            ((set<int,_std::less<int>,_std::allocator<int>_> *)
             &new_labels.super__Vector_base<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage);
  std::vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>::vector
            ((vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_> *)&out_pageno);
  afdh_map._M_t._M_impl.super__Rb_tree_header._M_node_count._7_1_ = 0;
  afdh_map._M_t._M_impl.super__Rb_tree_header._M_node_count._0_4_ = 0;
  std::
  map<unsigned_long_long,_std::shared_ptr<QPDFAcroFormDocumentHelper>,_std::less<unsigned_long_long>,_std::allocator<std::pair<const_unsigned_long_long,_std::shared_ptr<QPDFAcroFormDocumentHelper>_>_>_>
  ::map((map<unsigned_long_long,_std::shared_ptr<QPDFAcroFormDocumentHelper>,_std::less<unsigned_long_long>,_std::allocator<std::pair<const_unsigned_long_long,_std::shared_ptr<QPDFAcroFormDocumentHelper>_>_>_>
         *)&this_afdh);
  referenced_fields._M_t._M_impl.super__Rb_tree_header._M_node_count =
       (size_t)get_afdh_for_qpdf((map<unsigned_long_long,_std::shared_ptr<QPDFAcroFormDocumentHelper>,_std::less<unsigned_long_long>,_std::allocator<std::pair<const_unsigned_long_long,_std::shared_ptr<QPDFAcroFormDocumentHelper>_>_>_>
                                  *)&this_afdh,pdf);
  std::set<QPDFObjGen,_std::less<QPDFObjGen>,_std::allocator<QPDFObjGen>_>::set
            ((set<QPDFObjGen,_std::less<QPDFObjGen>,_std::allocator<QPDFObjGen>_> *)&__range1_3);
  psVar1 = &copied_pages._M_t._M_impl.super__Rb_tree_header._M_node_count;
  __end1_3 = std::
             vector<(anonymous_namespace)::QPDFPageData,_std::allocator<(anonymous_namespace)::QPDFPageData>_>
             ::begin((vector<(anonymous_namespace)::QPDFPageData,_std::allocator<(anonymous_namespace)::QPDFPageData>_>
                      *)psVar1);
  page_data_1 = (QPDFPageData *)
                std::
                vector<(anonymous_namespace)::QPDFPageData,_std::allocator<(anonymous_namespace)::QPDFPageData>_>
                ::end((vector<(anonymous_namespace)::QPDFPageData,_std::allocator<(anonymous_namespace)::QPDFPageData>_>
                       *)psVar1);
  while (bVar4 = __gnu_cxx::operator!=
                           (&__end1_3,
                            (__normal_iterator<(anonymous_namespace)::QPDFPageData_*,_std::vector<(anonymous_namespace)::QPDFPageData,_std::allocator<(anonymous_namespace)::QPDFPageData>_>_>
                             *)&page_data_1), bVar4) {
    __x = __gnu_cxx::
          __normal_iterator<(anonymous_namespace)::QPDFPageData_*,_std::vector<(anonymous_namespace)::QPDFPageData,_std::allocator<(anonymous_namespace)::QPDFPageData>_>_>
          ::operator*(&__end1_3);
    pldh.m.super___shared_ptr<QPDFPageLabelDocumentHelper::Members,_(__gnu_cxx::_Lock_policy)2>.
    _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    sVar21 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ClosedFileInputSource_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ClosedFileInputSource_*>_>_>
             ::count((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ClosedFileInputSource_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ClosedFileInputSource_*>_>_>
                      *)local_138,&__x->filename);
    if (sVar21 != 0) {
      ppCVar22 = std::
                 map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ClosedFileInputSource_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ClosedFileInputSource_*>_>_>
                 ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ClosedFileInputSource_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ClosedFileInputSource_*>_>_>
                               *)local_138,&__x->filename);
      pldh.m.super___shared_ptr<QPDFPageLabelDocumentHelper::Members,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)*ppCVar22;
      ClosedFileInputSource::stayOpen
                ((ClosedFileInputSource *)
                 pldh.m.
                 super___shared_ptr<QPDFPageLabelDocumentHelper::Members,_(__gnu_cxx::_Lock_policy)2>
                 ._M_refcount._M_pi,true);
    }
    QPDFPageLabelDocumentHelper::QPDFPageLabelDocumentHelper
              ((QPDFPageLabelDocumentHelper *)&other_afdh,__x->qpdf);
    local_518 = get_afdh_for_qpdf((map<unsigned_long_long,_std::shared_ptr<QPDFAcroFormDocumentHelper>,_std::less<unsigned_long_long>,_std::allocator<std::pair<const_unsigned_long_long,_std::shared_ptr<QPDFAcroFormDocumentHelper>_>_>_>
                                   *)&this_afdh,__x->qpdf);
    bVar4 = QPDFPageLabelDocumentHelper::hasPageLabels((QPDFPageLabelDocumentHelper *)&other_afdh);
    if (bVar4) {
      afdh_map._M_t._M_impl.super__Rb_tree_header._M_node_count._7_1_ = 1;
    }
    __range2_2 = (vector<int,_std::allocator<int>_> *)__x;
    std::function<void(Pipeline&,std::__cxx11::string_const&)>::
    function<QPDFJob::handlePageSpecs(QPDF&,std::vector<std::unique_ptr<QPDF,std::default_delete<QPDF>>,std::allocator<std::unique_ptr<QPDF,std::default_delete<QPDF>>>>&)::__3,void>
              ((function<void(Pipeline&,std::__cxx11::string_const&)> *)&local_538,
               (anon_class_8_1_4a400dfa *)&__range2_2);
    doIfVerbose(this,&local_538);
    std::
    function<void_(Pipeline_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
    ::~function(&local_538);
    __end2_2 = std::vector<int,_std::allocator<int>_>::begin(&__x->selected_pages);
    _pageno = std::vector<int,_std::allocator<int>_>::end(&__x->selected_pages);
    while (bVar4 = __gnu_cxx::operator!=
                             (&__end2_2,
                              (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> *)
                              &pageno), bVar4) {
      piVar23 = __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::
                operator*(&__end2_2);
      to_copy.m.super___shared_ptr<QPDFPageObjectHelper::Members,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi._4_4_ = *piVar23;
      to_copy.m.super___shared_ptr<QPDFPageObjectHelper::Members,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi._0_4_ =
           to_copy.m.super___shared_ptr<QPDFPageObjectHelper::Members,_(__gnu_cxx::_Lock_policy)2>.
           _M_refcount._M_pi._4_4_ + -1;
      new_start_idx = (long)(int)afdh_map._M_t._M_impl.super__Rb_tree_header._M_node_count;
      afdh_map._M_t._M_impl.super__Rb_tree_header._M_node_count._0_4_ =
           (int)afdh_map._M_t._M_impl.super__Rb_tree_header._M_node_count + 1;
      QPDFPageLabelDocumentHelper::getLabelsForPageRange
                ((QPDFPageLabelDocumentHelper *)&other_afdh,
                 (long)(int)to_copy.m.
                            super___shared_ptr<QPDFPageObjectHelper::Members,_(__gnu_cxx::_Lock_policy)2>
                            ._M_refcount._M_pi,
                 (long)(int)to_copy.m.
                            super___shared_ptr<QPDFPageObjectHelper::Members,_(__gnu_cxx::_Lock_policy)2>
                            ._M_refcount._M_pi,new_start_idx,
                 (vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_> *)&out_pageno);
      sVar24 = QIntC::to_size<int>((int *)&to_copy.m.
                                           super___shared_ptr<QPDFPageObjectHelper::Members,_(__gnu_cxx::_Lock_policy)2>
                                           ._M_refcount);
      pvVar25 = std::vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>::at
                          (&__x->orig_pages,sVar24);
      QPDFObjectHandle::QPDFObjectHandle((QPDFObjectHandle *)&to_copy_og,pvVar25);
      QPDFPageObjectHelper::QPDFPageObjectHelper
                ((QPDFPageObjectHelper *)local_598,(QPDFObjectHandle *)&to_copy_og);
      QPDFObjectHandle::~QPDFObjectHandle((QPDFObjectHandle *)&to_copy_og);
      QPDFObjectHelper::getObjectHandle((QPDFObjectHelper *)&from_uuid);
      local_5b0 = QPDFObjectHandle::getObjGen((QPDFObjectHandle *)&from_uuid);
      QPDFObjectHandle::~QPDFObjectHandle((QPDFObjectHandle *)&from_uuid);
      local_5c8 = QPDF::getUniqueId(__x->qpdf);
      pmVar26 = std::
                map<unsigned_long_long,_std::set<QPDFObjGen,_std::less<QPDFObjGen>,_std::allocator<QPDFObjGen>_>,_std::less<unsigned_long_long>,_std::allocator<std::pair<const_unsigned_long_long,_std::set<QPDFObjGen,_std::less<QPDFObjGen>,_std::allocator<QPDFObjGen>_>_>_>_>
                ::operator[]((map<unsigned_long_long,_std::set<QPDFObjGen,_std::less<QPDFObjGen>,_std::allocator<QPDFObjGen>_>,_std::less<unsigned_long_long>,_std::allocator<std::pair<const_unsigned_long_long,_std::set<QPDFObjGen,_std::less<QPDFObjGen>,_std::allocator<QPDFObjGen>_>_>_>_>
                              *)&__range1_1,&local_5c8);
      sVar32 = std::set<QPDFObjGen,_std::less<QPDFObjGen>,_std::allocator<QPDFObjGen>_>::count
                         (pmVar26,&local_5b0);
      if (sVar32 == 0) {
        pmVar26 = std::
                  map<unsigned_long_long,_std::set<QPDFObjGen,_std::less<QPDFObjGen>,_std::allocator<QPDFObjGen>_>,_std::less<unsigned_long_long>,_std::allocator<std::pair<const_unsigned_long_long,_std::set<QPDFObjGen,_std::less<QPDFObjGen>,_std::allocator<QPDFObjGen>_>_>_>_>
                  ::operator[]((map<unsigned_long_long,_std::set<QPDFObjGen,_std::less<QPDFObjGen>,_std::allocator<QPDFObjGen>_>,_std::less<unsigned_long_long>,_std::allocator<std::pair<const_unsigned_long_long,_std::set<QPDFObjGen,_std::less<QPDFObjGen>,_std::allocator<QPDFObjGen>_>_>_>_>
                                *)&__range1_1,&local_5c8);
        pVar36 = std::set<QPDFObjGen,_std::less<QPDFObjGen>,_std::allocator<QPDFObjGen>_>::insert
                           (pmVar26,&local_5b0);
        local_610 = (_Base_ptr)pVar36.first._M_node;
        local_608 = pVar36.second;
        pmVar27 = std::
                  map<unsigned_long_long,_bool,_std::less<unsigned_long_long>,_std::allocator<std::pair<const_unsigned_long_long,_bool>_>_>
                  ::operator[]((map<unsigned_long_long,_bool,_std::less<unsigned_long_long>,_std::allocator<std::pair<const_unsigned_long_long,_bool>_>_>
                                *)&__range2_1,&local_5c8);
        if ((*pmVar27 & 1U) != 0) {
          QPDFPageObjectHelper::removeUnreferencedResources((QPDFPageObjectHelper *)local_598);
        }
      }
      else {
        QTC::TC("qpdf","QPDFJob copy same page more than once",(uint)(__x->qpdf != pdf));
        QPDFPageObjectHelper::shallowCopyPage(&local_600,(QPDFPageObjectHelper *)local_598);
        QPDFPageObjectHelper::operator=((QPDFPageObjectHelper *)local_598,&local_600);
        QPDFPageObjectHelper::~QPDFPageObjectHelper(&local_600);
      }
      QPDFPageObjectHelper::QPDFPageObjectHelper
                ((QPDFPageObjectHelper *)local_648,(QPDFPageObjectHelper *)local_598);
      QPDFPageDocumentHelper::addPage
                ((QPDFPageDocumentHelper *)
                 &orig_pages.
                  super__Vector_base<QPDFPageObjectHelper,_std::allocator<QPDFPageObjectHelper>_>.
                  _M_impl.super__Vector_impl_data._M_end_of_storage,
                 (QPDFPageObjectHelper *)local_648,false);
      QPDFPageObjectHelper::~QPDFPageObjectHelper((QPDFPageObjectHelper *)local_648);
      bVar4 = false;
      bVar33 = __x->qpdf == pdf;
      if (bVar33) {
        sVar30 = std::set<int,_std::less<int>,_std::allocator<int>_>::count
                           ((set<int,_std::less<int>,_std::allocator<int>_> *)
                            &new_labels.
                             super__Vector_base<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>
                             ._M_impl.super__Vector_impl_data._M_end_of_storage,
                            (key_type *)
                            &to_copy.m.
                             super___shared_ptr<QPDFPageObjectHelper::Members,_(__gnu_cxx::_Lock_policy)2>
                             ._M_refcount);
        bVar4 = sVar30 == 0;
        pVar35 = std::set<int,_std::less<int>,_std::allocator<int>_>::insert
                           ((set<int,_std::less<int>,_std::allocator<int>_> *)
                            &new_labels.
                             super__Vector_base<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>
                             ._M_impl.super__Vector_impl_data._M_end_of_storage,
                            (value_type_conflict3 *)
                            &to_copy.m.
                             super___shared_ptr<QPDFPageObjectHelper::Members,_(__gnu_cxx::_Lock_policy)2>
                             ._M_refcount);
        new_page.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
        _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)pVar35.first._M_node;
      }
      QPDFPageObjectHelper::QPDFPageObjectHelper(&local_6a8,(QPDFPageObjectHelper *)local_598);
      added_page((QPDF *)local_670,(QPDFPageObjectHelper *)pdf);
      QPDFPageObjectHelper::~QPDFPageObjectHelper(&local_6a8);
      if (((!bVar33) && (bVar6 = QPDFAcroFormDocumentHelper::hasAcroForm(local_518), bVar6)) ||
         (!bVar4)) {
        if (bVar33) {
          if (!bVar4) {
            QTC::TC("qpdf","QPDFJob copy fields non-first from orig",0);
          }
        }
        else {
          QTC::TC("qpdf","QPDFJob copy fields not this file",0);
        }
        sVar24 = referenced_fields._M_t._M_impl.super__Rb_tree_header._M_node_count;
        QPDFObjectHandle::QPDFObjectHandle(&local_6b8,(QPDFObjectHandle *)local_670);
        QPDFObjectHelper::getObjectHandle((QPDFObjectHelper *)&e);
        QPDFAcroFormDocumentHelper::fixCopiedAnnotations
                  ((QPDFAcroFormDocumentHelper *)sVar24,&local_6b8,(QPDFObjectHandle *)&e,local_518,
                   (set<QPDFObjGen,_std::less<QPDFObjGen>,_std::allocator<QPDFObjGen>_> *)
                   &__range1_3);
        QPDFObjectHandle::~QPDFObjectHandle((QPDFObjectHandle *)&e);
        QPDFObjectHandle::~QPDFObjectHandle(&local_6b8);
      }
      QPDFObjectHandle::~QPDFObjectHandle((QPDFObjectHandle *)local_670);
      QPDFPageObjectHelper::~QPDFPageObjectHelper((QPDFPageObjectHelper *)local_598);
      __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::operator++
                (&__end2_2);
    }
    if (pldh.m.super___shared_ptr<QPDFPageLabelDocumentHelper::Members,_(__gnu_cxx::_Lock_policy)2>.
        _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      ClosedFileInputSource::stayOpen
                ((ClosedFileInputSource *)
                 pldh.m.
                 super___shared_ptr<QPDFPageLabelDocumentHelper::Members,_(__gnu_cxx::_Lock_policy)2>
                 ._M_refcount._M_pi,false);
    }
    QPDFPageLabelDocumentHelper::~QPDFPageLabelDocumentHelper
              ((QPDFPageLabelDocumentHelper *)&other_afdh);
    __gnu_cxx::
    __normal_iterator<(anonymous_namespace)::QPDFPageData_*,_std::vector<(anonymous_namespace)::QPDFPageData,_std::allocator<(anonymous_namespace)::QPDFPageData>_>_>
    ::operator++(&__end1_3);
  }
  if ((afdh_map._M_t._M_impl.super__Rb_tree_header._M_node_count._7_1_ & 1) != 0) {
    QPDFObjectHandle::newDictionary();
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_790,"/Nums",&local_791);
    QPDFObjectHandle::newArray
              (&local_7a8,(vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_> *)&out_pageno
              );
    QPDFObjectHandle::replaceKey((QPDFObjectHandle *)local_770,&local_790,&local_7a8);
    QPDFObjectHandle::~QPDFObjectHandle(&local_7a8);
    std::__cxx11::string::~string((string *)&local_790);
    std::allocator<char>::~allocator(&local_791);
    QPDF::getRoot((QPDF *)&local_7b8);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_7d8,"/PageLabels",(allocator<char> *)((long)&pageno_1 + 7));
    QPDFObjectHandle::replaceKey(&local_7b8,&local_7d8,(QPDFObjectHandle *)local_770);
    std::__cxx11::string::~string((string *)&local_7d8);
    std::allocator<char>::~allocator((allocator<char> *)((long)&pageno_1 + 7));
    QPDFObjectHandle::~QPDFObjectHandle(&local_7b8);
    QPDFObjectHandle::~QPDFObjectHandle((QPDFObjectHandle *)local_770);
  }
  for (page_1.m.super___shared_ptr<QPDFPageObjectHelper::Members,_(__gnu_cxx::_Lock_policy)2>.
       _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      _Var3._M_pi = page_1.m.
                    super___shared_ptr<QPDFPageObjectHelper::Members,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount._M_pi,
      p_Var28 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                std::vector<QPDFPageObjectHelper,_std::allocator<QPDFPageObjectHelper>_>::size
                          ((vector<QPDFPageObjectHelper,_std::allocator<QPDFPageObjectHelper>_> *)
                           &__range1_2), _Var3._M_pi < p_Var28;
      page_1.m.super___shared_ptr<QPDFPageObjectHelper::Members,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi =
           (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
           ((long)&(page_1.m.
                    super___shared_ptr<QPDFPageObjectHelper::Members,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount._M_pi)->_vptr__Sp_counted_base + 1)) {
    pvVar29 = std::vector<QPDFPageObjectHelper,_std::allocator<QPDFPageObjectHelper>_>::at
                        ((vector<QPDFPageObjectHelper,_std::allocator<QPDFPageObjectHelper>_> *)
                         &__range1_2,
                         (size_type)
                         page_1.m.
                         super___shared_ptr<QPDFPageObjectHelper::Members,_(__gnu_cxx::_Lock_policy)2>
                         ._M_refcount._M_pi);
    QPDFPageObjectHelper::QPDFPageObjectHelper((QPDFPageObjectHelper *)local_820,pvVar29);
    __range3._4_4_ =
         QIntC::to_int<unsigned_long>
                   ((unsigned_long *)
                    &page_1.m.
                     super___shared_ptr<QPDFPageObjectHelper::Members,_(__gnu_cxx::_Lock_policy)2>.
                     _M_refcount);
    sVar30 = std::set<int,_std::less<int>,_std::allocator<int>_>::count
                       ((set<int,_std::less<int>,_std::allocator<int>_> *)
                        &new_labels.
                         super__Vector_base<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>.
                         _M_impl.super__Vector_impl_data._M_end_of_storage,
                        (key_type *)((long)&__range3 + 4));
    sVar24 = referenced_fields._M_t._M_impl.super__Rb_tree_header._M_node_count;
    if (sVar30 == 0) {
      QPDFObjectHelper::getObjectHandle(&local_908);
      local_908.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi =
           (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
           QPDFObjectHandle::getObjGen((QPDFObjectHandle *)&local_908);
      QPDFObjectHandle::newNull();
      QPDF::replaceObject(pdf,(QPDFObjGen)
                              local_908.super_BaseHandle.obj.
                              super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount
                              ._M_pi,
                          (QPDFObjectHandle *)
                          &acroform.super_BaseHandle.obj.
                           super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
      QPDFObjectHandle::~QPDFObjectHandle
                ((QPDFObjectHandle *)
                 &acroform.super_BaseHandle.obj.
                  super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
      QPDFObjectHandle::~QPDFObjectHandle((QPDFObjectHandle *)&local_908);
    }
    else {
      QPDFPageObjectHelper::QPDFPageObjectHelper
                ((QPDFPageObjectHelper *)&__begin3,(QPDFPageObjectHelper *)local_820);
      QPDFAcroFormDocumentHelper::getFormFieldsForPage
                (&local_848,(QPDFAcroFormDocumentHelper *)sVar24,(QPDFPageObjectHelper *)&__begin3);
      QPDFPageObjectHelper::~QPDFPageObjectHelper((QPDFPageObjectHelper *)&__begin3);
      local_830 = &local_848;
      __end3 = std::vector<QPDFFormFieldObjectHelper,_std::allocator<QPDFFormFieldObjectHelper>_>::
               begin(local_830);
      field.m.super___shared_ptr<QPDFFormFieldObjectHelper::Members,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi =
           (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
           std::vector<QPDFFormFieldObjectHelper,_std::allocator<QPDFFormFieldObjectHelper>_>::end
                     (local_830);
      while (bVar4 = __gnu_cxx::operator!=
                               (&__end3,(__normal_iterator<QPDFFormFieldObjectHelper_*,_std::vector<QPDFFormFieldObjectHelper,_std::allocator<QPDFFormFieldObjectHelper>_>_>
                                         *)&field.m.
                                            super___shared_ptr<QPDFFormFieldObjectHelper::Members,_(__gnu_cxx::_Lock_policy)2>
                                            ._M_refcount), bVar4) {
        pQVar31 = __gnu_cxx::
                  __normal_iterator<QPDFFormFieldObjectHelper_*,_std::vector<QPDFFormFieldObjectHelper,_std::allocator<QPDFFormFieldObjectHelper>_>_>
                  ::operator*(&__end3);
        QPDFFormFieldObjectHelper::QPDFFormFieldObjectHelper
                  ((QPDFFormFieldObjectHelper *)(local_8e0 + 0x18),pQVar31);
        QTC::TC("qpdf","QPDFJob pages keeping field from original",0);
        QPDFObjectHelper::getObjectHandle((QPDFObjectHelper *)local_8e0);
        local_8e0._16_8_ = QPDFObjectHandle::getObjGen((QPDFObjectHandle *)local_8e0);
        pVar36 = std::set<QPDFObjGen,_std::less<QPDFObjGen>,_std::allocator<QPDFObjGen>_>::insert
                           ((set<QPDFObjGen,_std::less<QPDFObjGen>,_std::allocator<QPDFObjGen>_> *)
                            &__range1_3,(value_type *)(local_8e0 + 0x10));
        local_908.oh_.super_BaseHandle.obj.
        super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
             (element_type *)pVar36.first._M_node;
        local_908.oh_.super_BaseHandle.obj.
        super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi._0_1_ =
             pVar36.second;
        QPDFObjectHandle::~QPDFObjectHandle((QPDFObjectHandle *)local_8e0);
        QPDFFormFieldObjectHelper::~QPDFFormFieldObjectHelper
                  ((QPDFFormFieldObjectHelper *)(local_8e0 + 0x18));
        __gnu_cxx::
        __normal_iterator<QPDFFormFieldObjectHelper_*,_std::vector<QPDFFormFieldObjectHelper,_std::allocator<QPDFFormFieldObjectHelper>_>_>
        ::operator++(&__end3);
      }
      std::vector<QPDFFormFieldObjectHelper,_std::allocator<QPDFFormFieldObjectHelper>_>::~vector
                (&local_848);
    }
    QPDFPageObjectHelper::~QPDFPageObjectHelper((QPDFPageObjectHelper *)local_820);
  }
  bVar4 = QPDFAcroFormDocumentHelper::hasAcroForm
                    ((QPDFAcroFormDocumentHelper *)
                     referenced_fields._M_t._M_impl.super__Rb_tree_header._M_node_count);
  if (bVar4) {
    QPDF::getRoot((QPDF *)local_938);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (local_958,"/AcroForm",
               (allocator<char> *)
               ((long)&fields.super_BaseHandle.obj.
                       super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
               + 7));
    QPDFObjectHandle::getKey((QPDFObjectHandle *)(local_938 + 0x10),(string *)local_938);
    std::__cxx11::string::~string(local_958);
    std::allocator<char>::~allocator
              ((allocator<char> *)
               ((long)&fields.super_BaseHandle.obj.
                       super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
               + 7));
    QPDFObjectHandle::~QPDFObjectHandle((QPDFObjectHandle *)local_938);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (local_990,"/Fields",
               (allocator<char> *)
               ((long)&new_fields.super_BaseHandle.obj.
                       super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
               + 7));
    QPDFObjectHandle::getKey((QPDFObjectHandle *)local_970,(string *)(local_938 + 0x10));
    std::__cxx11::string::~string(local_990);
    std::allocator<char>::~allocator
              ((allocator<char> *)
               ((long)&new_fields.super_BaseHandle.obj.
                       super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
               + 7));
    bVar4 = QPDFObjectHandle::isArray((QPDFObjectHandle *)local_970);
    if (bVar4) {
      QPDFObjectHandle::newArray();
      bVar4 = QPDFObjectHandle::isIndirect((QPDFObjectHandle *)local_970);
      if (bVar4) {
        QPDFObjectHandle::QPDFObjectHandle
                  ((QPDFObjectHandle *)&__range3_1,(QPDFObjectHandle *)local_9a8);
        QPDF::makeIndirectObject((QPDF *)&local_9b8,(QPDFObjectHandle *)pdf);
        QPDFObjectHandle::operator=((QPDFObjectHandle *)local_9a8,&local_9b8);
        QPDFObjectHandle::~QPDFObjectHandle(&local_9b8);
        QPDFObjectHandle::~QPDFObjectHandle((QPDFObjectHandle *)&__range3_1);
      }
      QPDFObjectHandle::aitems
                ((QPDFObjectHandle *)
                 &__begin3_1.ivalue.super_BaseHandle.obj.
                  super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
      this_00 = &__begin3_1.ivalue.super_BaseHandle.obj.
                 super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount;
      QPDFObjectHandle::QPDFArrayItems::begin
                ((iterator *)
                 &__end3_1.ivalue.super_BaseHandle.obj.
                  super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount,
                 (QPDFArrayItems *)this_00);
      QPDFObjectHandle::QPDFArrayItems::end((iterator *)&field_1,(QPDFArrayItems *)this_00);
      while (bVar4 = QPDFObjectHandle::QPDFArrayItems::iterator::operator!=
                               ((iterator *)
                                &__end3_1.ivalue.super_BaseHandle.obj.
                                 super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
                                 _M_refcount,(iterator *)&field_1), bVar4) {
        local_a38 = QPDFObjectHandle::QPDFArrayItems::iterator::operator*
                              ((iterator *)
                               &__end3_1.ivalue.super_BaseHandle.obj.
                                super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
                                _M_refcount);
        local_a40 = QPDFObjectHandle::getObjGen(local_a38);
        sVar32 = std::set<QPDFObjGen,_std::less<QPDFObjGen>,_std::allocator<QPDFObjGen>_>::count
                           ((set<QPDFObjGen,_std::less<QPDFObjGen>,_std::allocator<QPDFObjGen>_> *)
                            &__range1_3,&local_a40);
        if (sVar32 != 0) {
          QPDFObjectHandle::appendItem((QPDFObjectHandle *)local_9a8,local_a38);
        }
        QPDFObjectHandle::QPDFArrayItems::iterator::operator++
                  ((iterator *)
                   &__end3_1.ivalue.super_BaseHandle.obj.
                    super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
      }
      QPDFObjectHandle::QPDFArrayItems::iterator::~iterator((iterator *)&field_1);
      QPDFObjectHandle::QPDFArrayItems::iterator::~iterator
                ((iterator *)
                 &__end3_1.ivalue.super_BaseHandle.obj.
                  super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
      QPDFObjectHandle::QPDFArrayItems::~QPDFArrayItems
                ((QPDFArrayItems *)
                 &__begin3_1.ivalue.super_BaseHandle.obj.
                  super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
      iVar7 = QPDFObjectHandle::getArrayNItems((QPDFObjectHandle *)local_9a8);
      if (iVar7 < 1) {
        QTC::TC("qpdf","QPDFJob no more fields in pages",0);
        QPDF::getRoot((QPDF *)&local_a78);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_a98,"/AcroForm",&local_a99);
        QPDFObjectHandle::removeKey(&local_a78,&local_a98);
        std::__cxx11::string::~string((string *)&local_a98);
        std::allocator<char>::~allocator(&local_a99);
        QPDFObjectHandle::~QPDFObjectHandle(&local_a78);
      }
      else {
        QTC::TC("qpdf","QPDFJob keep some fields in pages",0);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_a60,"/Fields",&local_a61);
        QPDFObjectHandle::replaceKey
                  ((QPDFObjectHandle *)(local_938 + 0x10),&local_a60,(QPDFObjectHandle *)local_9a8);
        std::__cxx11::string::~string((string *)&local_a60);
        std::allocator<char>::~allocator(&local_a61);
      }
      QPDFObjectHandle::~QPDFObjectHandle((QPDFObjectHandle *)local_9a8);
    }
    QPDFObjectHandle::~QPDFObjectHandle((QPDFObjectHandle *)local_970);
    QPDFObjectHandle::~QPDFObjectHandle((QPDFObjectHandle *)(local_938 + 0x10));
  }
  std::set<QPDFObjGen,_std::less<QPDFObjGen>,_std::allocator<QPDFObjGen>_>::~set
            ((set<QPDFObjGen,_std::less<QPDFObjGen>,_std::allocator<QPDFObjGen>_> *)&__range1_3);
  std::
  map<unsigned_long_long,_std::shared_ptr<QPDFAcroFormDocumentHelper>,_std::less<unsigned_long_long>,_std::allocator<std::pair<const_unsigned_long_long,_std::shared_ptr<QPDFAcroFormDocumentHelper>_>_>_>
  ::~map((map<unsigned_long_long,_std::shared_ptr<QPDFAcroFormDocumentHelper>,_std::less<unsigned_long_long>,_std::allocator<std::pair<const_unsigned_long_long,_std::shared_ptr<QPDFAcroFormDocumentHelper>_>_>_>
          *)&this_afdh);
  std::vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>::~vector
            ((vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_> *)&out_pageno);
  std::set<int,_std::less<int>,_std::allocator<int>_>::~set
            ((set<int,_std::less<int>,_std::allocator<int>_> *)
             &new_labels.super__Vector_base<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage);
  std::vector<QPDFPageObjectHelper,_std::allocator<QPDFPageObjectHelper>_>::~vector
            ((vector<QPDFPageObjectHelper,_std::allocator<QPDFPageObjectHelper>_> *)&__range1_2);
  QPDFPageDocumentHelper::~QPDFPageDocumentHelper
            ((QPDFPageDocumentHelper *)
             &orig_pages.
              super__Vector_base<QPDFPageObjectHelper,_std::allocator<QPDFPageObjectHelper>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage);
  std::
  map<unsigned_long_long,_bool,_std::less<unsigned_long_long>,_std::allocator<std::pair<const_unsigned_long_long,_bool>_>_>
  ::~map((map<unsigned_long_long,_bool,_std::less<unsigned_long_long>,_std::allocator<std::pair<const_unsigned_long_long,_bool>_>_>
          *)&__range2_1);
  std::
  map<unsigned_long_long,_std::set<QPDFObjGen,_std::less<QPDFObjGen>,_std::allocator<QPDFObjGen>_>,_std::less<unsigned_long_long>,_std::allocator<std::pair<const_unsigned_long_long,_std::set<QPDFObjGen,_std::less<QPDFObjGen>,_std::allocator<QPDFObjGen>_>_>_>_>
  ::~map((map<unsigned_long_long,_std::set<QPDFObjGen,_std::less<QPDFObjGen>,_std::allocator<QPDFObjGen>_>,_std::less<unsigned_long_long>,_std::allocator<std::pair<const_unsigned_long_long,_std::set<QPDFObjGen,_std::less<QPDFObjGen>,_std::allocator<QPDFObjGen>_>_>_>_>
          *)&__range1_1);
  std::
  vector<(anonymous_namespace)::QPDFPageData,_std::allocator<(anonymous_namespace)::QPDFPageData>_>
  ::~vector((vector<(anonymous_namespace)::QPDFPageData,_std::allocator<(anonymous_namespace)::QPDFPageData>_>
             *)&copied_pages._M_t._M_impl.super__Rb_tree_header._M_node_count);
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ClosedFileInputSource_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ClosedFileInputSource_*>_>_>
  ::~map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ClosedFileInputSource_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ClosedFileInputSource_*>_>_>
          *)local_138);
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_QPDF_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_QPDF_*>_>_>
  ::~map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_QPDF_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_QPDF_*>_>_>
          *)&page_spec_cfis._M_t._M_impl.super__Rb_tree_header._M_node_count);
  return;
}

Assistant:

void
QPDFJob::handlePageSpecs(QPDF& pdf, std::vector<std::unique_ptr<QPDF>>& page_heap)
{
    // Parse all page specifications and translate them into lists of actual pages.

    // Handle "." as a shortcut for the input file
    for (auto& page_spec: m->page_specs) {
        if (page_spec.filename == ".") {
            page_spec.filename = m->infilename.get();
        }
        if (page_spec.range.empty()) {
            page_spec.range = "1-z";
        }
    }

    if (!m->keep_files_open_set) {
        // Count the number of distinct files to determine whether we should keep files open or not.
        // Rather than trying to code some portable heuristic based on OS limits, just hard-code
        // this at a given number and allow users to override.
        std::set<std::string> filenames;
        for (auto& page_spec: m->page_specs) {
            filenames.insert(page_spec.filename);
        }
        m->keep_files_open = (filenames.size() <= m->keep_files_open_threshold);
        QTC::TC("qpdf", "QPDFJob automatically set keep files open", m->keep_files_open ? 0 : 1);
        doIfVerbose([&](Pipeline& v, std::string const& prefix) {
            v << prefix << ": selecting --keep-open-files=" << (m->keep_files_open ? "y" : "n")
              << "\n";
        });
    }

    // Create a QPDF object for each file that we may take pages from.
    std::map<std::string, QPDF*> page_spec_qpdfs;
    std::map<std::string, ClosedFileInputSource*> page_spec_cfis;
    page_spec_qpdfs[m->infilename.get()] = &pdf;
    std::vector<QPDFPageData> parsed_specs;
    std::map<unsigned long long, std::set<QPDFObjGen>> copied_pages;
    for (auto& page_spec: m->page_specs) {
        if (page_spec_qpdfs.count(page_spec.filename) == 0) {
            // Open the PDF file and store the QPDF object. Throw a std::shared_ptr to the qpdf into
            // a heap so that it survives through copying to the output but gets cleaned up
            // automatically at the end. Do not canonicalize the file name. Using two different
            // paths to refer to the same file is a documented workaround for duplicating a page. If
            // you are using this an example of how to do this with the API, you can just create two
            // different QPDF objects to the same underlying file with the same path to achieve the
            // same effect.
            char const* password = page_spec.password.get();
            if ((!m->encryption_file.empty()) && (password == nullptr) &&
                (page_spec.filename == m->encryption_file)) {
                QTC::TC("qpdf", "QPDFJob pages encryption password");
                password = m->encryption_file_password.get();
            }
            doIfVerbose([&](Pipeline& v, std::string const& prefix) {
                v << prefix << ": processing " << page_spec.filename << "\n";
            });
            std::shared_ptr<InputSource> is;
            ClosedFileInputSource* cis = nullptr;
            if (!m->keep_files_open) {
                QTC::TC("qpdf", "QPDFJob keep files open n");
                cis = new ClosedFileInputSource(page_spec.filename.c_str());
                is = std::shared_ptr<InputSource>(cis);
                cis->stayOpen(true);
            } else {
                QTC::TC("qpdf", "QPDFJob keep files open y");
                FileInputSource* fis = new FileInputSource(page_spec.filename.c_str());
                is = std::shared_ptr<InputSource>(fis);
            }
            std::unique_ptr<QPDF> qpdf_sp;
            processInputSource(qpdf_sp, is, password, true);
            page_spec_qpdfs[page_spec.filename] = qpdf_sp.get();
            page_heap.push_back(std::move(qpdf_sp));
            if (cis) {
                cis->stayOpen(false);
                page_spec_cfis[page_spec.filename] = cis;
            }
        }

        // Read original pages from the PDF, and parse the page range associated with this
        // occurrence of the file.
        parsed_specs.emplace_back(
            page_spec.filename, page_spec_qpdfs[page_spec.filename], page_spec.range);
    }

    std::map<unsigned long long, bool> remove_unreferenced;
    if (m->remove_unreferenced_page_resources != QPDFJob::re_no) {
        for (auto const& iter: page_spec_qpdfs) {
            std::string const& filename = iter.first;
            ClosedFileInputSource* cis = nullptr;
            if (page_spec_cfis.count(filename)) {
                cis = page_spec_cfis[filename];
                cis->stayOpen(true);
            }
            QPDF& other(*(iter.second));
            auto other_uuid = other.getUniqueId();
            if (remove_unreferenced.count(other_uuid) == 0) {
                remove_unreferenced[other_uuid] = shouldRemoveUnreferencedResources(other);
            }
            if (cis) {
                cis->stayOpen(false);
            }
        }
    }

    // Clear all pages out of the primary QPDF's pages tree but leave the objects in place in the
    // file so they can be re-added without changing their object numbers. This enables other things
    // in the original file, such as outlines, to continue to work.
    doIfVerbose([&](Pipeline& v, std::string const& prefix) {
        v << prefix << ": removing unreferenced pages from primary input\n";
    });
    QPDFPageDocumentHelper dh(pdf);
    std::vector<QPDFPageObjectHelper> orig_pages = dh.getAllPages();
    for (auto const& page: orig_pages) {
        dh.removePage(page);
    }

    auto n_collate = m->collate.size();
    auto n_specs = parsed_specs.size();
    if (!(n_collate == 0 || n_collate == 1 || n_collate == n_specs)) {
        usage(
            "--pages: if --collate has more than one value, it must have one value per page "
            "specification");
    }
    if (n_collate > 0 && n_specs > 1) {
        // Collate the pages by selecting one page from each spec in order. When a spec runs out of
        // pages, stop selecting from it.
        std::vector<QPDFPageData> new_parsed_specs;
        // Make sure we have a collate value for each spec. We have already checked that a non-empty
        // collate has either one value or one value per spec.
        for (auto i = n_collate; i < n_specs; ++i) {
            m->collate.push_back(m->collate.at(0));
        }
        std::vector<size_t> cur_page(n_specs, 0);
        bool got_pages = true;
        while (got_pages) {
            got_pages = false;
            for (size_t i = 0; i < n_specs; ++i) {
                QPDFPageData& page_data = parsed_specs.at(i);
                for (size_t j = 0; j < m->collate.at(i); ++j) {
                    if (cur_page.at(i) + j < page_data.selected_pages.size()) {
                        got_pages = true;
                        new_parsed_specs.emplace_back(
                            page_data, page_data.selected_pages.at(cur_page.at(i) + j));
                    }
                }
                cur_page.at(i) += m->collate.at(i);
            }
        }
        parsed_specs = new_parsed_specs;
    }

    // Add all the pages from all the files in the order specified. Keep track of any pages from the
    // original file that we are selecting.
    std::set<int> selected_from_orig;
    std::vector<QPDFObjectHandle> new_labels;
    bool any_page_labels = false;
    int out_pageno = 0;
    std::map<unsigned long long, std::shared_ptr<QPDFAcroFormDocumentHelper>> afdh_map;
    auto this_afdh = get_afdh_for_qpdf(afdh_map, &pdf);
    std::set<QPDFObjGen> referenced_fields;
    for (auto& page_data: parsed_specs) {
        ClosedFileInputSource* cis = nullptr;
        if (page_spec_cfis.count(page_data.filename)) {
            cis = page_spec_cfis[page_data.filename];
            cis->stayOpen(true);
        }
        QPDFPageLabelDocumentHelper pldh(*page_data.qpdf);
        auto other_afdh = get_afdh_for_qpdf(afdh_map, page_data.qpdf);
        if (pldh.hasPageLabels()) {
            any_page_labels = true;
        }
        doIfVerbose([&](Pipeline& v, std::string const& prefix) {
            v << prefix << ": adding pages from " << page_data.filename << "\n";
        });
        for (auto pageno_iter: page_data.selected_pages) {
            // Pages are specified from 1 but numbered from 0 in the vector
            int pageno = pageno_iter - 1;
            pldh.getLabelsForPageRange(pageno, pageno, out_pageno++, new_labels);
            QPDFPageObjectHelper to_copy = page_data.orig_pages.at(QIntC::to_size(pageno));
            QPDFObjGen to_copy_og = to_copy.getObjectHandle().getObjGen();
            unsigned long long from_uuid = page_data.qpdf->getUniqueId();
            if (copied_pages[from_uuid].count(to_copy_og)) {
                QTC::TC(
                    "qpdf",
                    "QPDFJob copy same page more than once",
                    (page_data.qpdf == &pdf) ? 0 : 1);
                to_copy = to_copy.shallowCopyPage();
            } else {
                copied_pages[from_uuid].insert(to_copy_og);
                if (remove_unreferenced[from_uuid]) {
                    to_copy.removeUnreferencedResources();
                }
            }
            dh.addPage(to_copy, false);
            bool first_copy_from_orig = false;
            bool this_file = (page_data.qpdf == &pdf);
            if (this_file) {
                // This is a page from the original file. Keep track of the fact that we are using
                // it.
                first_copy_from_orig = (selected_from_orig.count(pageno) == 0);
                selected_from_orig.insert(pageno);
            }
            auto new_page = added_page(pdf, to_copy);
            // Try to avoid gratuitously renaming fields. In the case of where we're just extracting
            // a bunch of pages from the original file and not copying any page more than once,
            // there's no reason to do anything with the fields. Since we don't remove fields from
            // the original file until all copy operations are completed, any foreign pages that
            // conflict with original pages will be adjusted. If we copy any page from the original
            // file more than once, that page would be in conflict with the previous copy of itself.
            if ((!this_file && other_afdh->hasAcroForm()) || !first_copy_from_orig) {
                if (!this_file) {
                    QTC::TC("qpdf", "QPDFJob copy fields not this file");
                } else if (!first_copy_from_orig) {
                    QTC::TC("qpdf", "QPDFJob copy fields non-first from orig");
                }
                try {
                    this_afdh->fixCopiedAnnotations(
                        new_page, to_copy.getObjectHandle(), *other_afdh, &referenced_fields);
                } catch (std::exception& e) {
                    pdf.warn(
                        qpdf_e_damaged_pdf,
                        "",
                        0,
                        ("Exception caught while fixing copied annotations. This may be a qpdf "
                         "bug. " +
                         std::string("Exception: ") + e.what()));
                }
            }
        }
        if (cis) {
            cis->stayOpen(false);
        }
    }
    if (any_page_labels) {
        QPDFObjectHandle page_labels = QPDFObjectHandle::newDictionary();
        page_labels.replaceKey("/Nums", QPDFObjectHandle::newArray(new_labels));
        pdf.getRoot().replaceKey("/PageLabels", page_labels);
    }

    // Delete page objects for unused page in primary. This prevents those objects from being
    // preserved by being referred to from other places, such as the outlines dictionary. Also make
    // sure we keep form fields from pages we preserved.
    for (size_t pageno = 0; pageno < orig_pages.size(); ++pageno) {
        auto page = orig_pages.at(pageno);
        if (selected_from_orig.count(QIntC::to_int(pageno))) {
            for (auto field: this_afdh->getFormFieldsForPage(page)) {
                QTC::TC("qpdf", "QPDFJob pages keeping field from original");
                referenced_fields.insert(field.getObjectHandle().getObjGen());
            }
        } else {
            pdf.replaceObject(page.getObjectHandle().getObjGen(), QPDFObjectHandle::newNull());
        }
    }
    // Remove unreferenced form fields
    if (this_afdh->hasAcroForm()) {
        auto acroform = pdf.getRoot().getKey("/AcroForm");
        auto fields = acroform.getKey("/Fields");
        if (fields.isArray()) {
            auto new_fields = QPDFObjectHandle::newArray();
            if (fields.isIndirect()) {
                new_fields = pdf.makeIndirectObject(new_fields);
            }
            for (auto const& field: fields.aitems()) {
                if (referenced_fields.count(field.getObjGen())) {
                    new_fields.appendItem(field);
                }
            }
            if (new_fields.getArrayNItems() > 0) {
                QTC::TC("qpdf", "QPDFJob keep some fields in pages");
                acroform.replaceKey("/Fields", new_fields);
            } else {
                QTC::TC("qpdf", "QPDFJob no more fields in pages");
                pdf.getRoot().removeKey("/AcroForm");
            }
        }
    }
}